

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

void absl::lts_20240722::Mutex::InternalAttemptToUseMutexInFatalSignalHandler(void)

{
  long lVar1;
  
  lVar1 = absl::lts_20240722::base_internal::CurrentThreadIdentityIfPresent();
  if (lVar1 != 0) {
    *(undefined1 *)(lVar1 + 0x14) = 1;
  }
  _ZN4absl12lts_2024072212_GLOBAL__N_124synch_deadlock_detectionE_0 = 0;
  return;
}

Assistant:

void Mutex::InternalAttemptToUseMutexInFatalSignalHandler() {
  // Fix the per-thread state only if it exists.
  ThreadIdentity* identity = CurrentThreadIdentityIfPresent();
  if (identity != nullptr) {
    identity->per_thread_synch.suppress_fatal_errors = true;
  }
  // Don't do deadlock detection when we are already failing.
  synch_deadlock_detection.store(OnDeadlockCycle::kIgnore,
                                 std::memory_order_release);
}